

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void * SensorChangeHandler(void *service)

{
  int iVar1;
  
  do {
    do {
      while( true ) {
        getBtnsState_abi_cxx11_();
        iVar1 = std::__cxx11::string::compare((string *)&BtnState_abi_cxx11_);
        if (iVar1 != 0) break;
        usleep(1);
      }
      usleep(20000);
      getBtnsState_abi_cxx11_();
      iVar1 = std::__cxx11::string::compare((string *)&BtnState_abi_cxx11_);
    } while (iVar1 == 0);
    std::__cxx11::string::replace
              (0x1093a0,0,(string *)getBtnsState[abi:cxx11]()::sState_abi_cxx11_._M_string_length);
    sendBtnsState((fnode_service_t *)service,&BtnState_abi_cxx11_);
  } while( true );
}

Assistant:

void* SensorChangeHandler(void* service)
{
	for(;;)
	{
		while(BtnState.compare(getBtnsState()) == 0)
		{
			usleep(1);
		}
		
		usleep(20000);
		const string& unconfirmedState = getBtnsState();
		if(BtnState.compare(unconfirmedState) != 0)
		{
			BtnState.replace(0, unconfirmedState.length(), unconfirmedState);			
			sendBtnsState((fnode_service_t *)service, BtnState);
		}  
	}    
}